

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

void __thiscall cancel_handler::operator()(cancel_handler *this,error_code *e)

{
  callback *pcVar1;
  bool bVar2;
  ostream *poVar3;
  error_code *in_RSI;
  callback<void_()> *in_RDI;
  error_code *in_stack_ffffffffffffffa8;
  cancel_handler in_stack_ffffffffffffffc0;
  error_code local_20 [2];
  
  std::error_code::error_code(local_20,1,booster::aio::aio_error_cat);
  bVar2 = std::operator==(in_RSI,in_stack_ffffffffffffffa8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,
                             "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
                            );
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x82);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  cancel_called = cancel_called + 1;
  pcVar1 = (callback *)(in_RDI->call_ptr).p_;
  booster::callback<void_()>::callback<cancel_handler>(in_RDI,in_stack_ffffffffffffffc0);
  booster::aio::io_service::post(pcVar1);
  booster::callback<void_()>::~callback((callback<void_()> *)0x10a1aa);
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
	{
		TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
		cancel_called ++;
		srv->post(*this);
	}